

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O0

void __thiscall Potassco::ProgramOptions::ValueError::~ValueError(ValueError *this)

{
  ValueError *in_RDI;
  
  ~ValueError(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

~ValueError() throw () {}